

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeCommand.cxx
# Opt level: O2

bool __thiscall
cmIncludeCommand::InitialPass
          (cmIncludeCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *pcVar3;
  cmCommand *this_00;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  PolicyStatus PVar7;
  undefined7 extraout_var;
  char *pcVar8;
  cmGlobalGenerator *this_01;
  ostream *poVar9;
  PolicyID id;
  uint uVar10;
  MessageType t;
  ulong uVar11;
  allocator local_239;
  cmCommand *local_238;
  undefined4 local_22c;
  string m;
  string fname_abs;
  string fname;
  string resultVarName;
  string listFile;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar1 || 0x80 < (ulong)((long)pbVar2 - (long)pbVar1)) {
    std::__cxx11::string::string
              ((string *)&listFile,
               "called with wrong number of arguments.  include() only takes one file.",
               (allocator *)&fname);
    cmCommand::SetError(&this->super_cmCommand,&listFile);
    std::__cxx11::string::~string((string *)&listFile);
    return false;
  }
  local_238 = &this->super_cmCommand;
  std::__cxx11::string::string((string *)&fname,(string *)pbVar1);
  resultVarName._M_dataplus._M_p = (pointer)&resultVarName.field_2;
  resultVarName._M_string_length = 0;
  resultVarName.field_2._M_local_buf[0] = '\0';
  uVar11 = 1;
  bVar6 = false;
  local_22c = 0;
  while( true ) {
    uVar10 = (uint)uVar11;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar11)
    break;
    bVar4 = std::operator==(pbVar1 + uVar11,"OPTIONAL");
    if (bVar4) {
      bVar4 = true;
      if (bVar6) {
        std::__cxx11::string::string
                  ((string *)&listFile,"called with invalid arguments: OPTIONAL used twice",
                   (allocator *)&fname_abs);
        cmCommand::SetError(local_238,&listFile);
        goto LAB_003c1b1f;
      }
    }
    else {
      bVar5 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar11,"RESULT_VARIABLE")
      ;
      bVar4 = bVar6;
      if (bVar5) {
        if (resultVarName._M_string_length == 0) {
          uVar10 = uVar10 + 1;
          if ((ulong)uVar10 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)&resultVarName);
            goto LAB_003c1741;
          }
          std::__cxx11::string::string
                    ((string *)&listFile,"called with no value for RESULT_VARIABLE.",
                     (allocator *)&fname_abs);
          cmCommand::SetError(local_238,&listFile);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&listFile,
                     "called with invalid arguments: only one result variable allowed",
                     (allocator *)&fname_abs);
          cmCommand::SetError(local_238,&listFile);
        }
LAB_003c1b1f:
        std::__cxx11::string::~string((string *)&listFile);
        bVar4 = false;
        goto LAB_003c1bad;
      }
      bVar6 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar11,"NO_POLICY_SCOPE")
      ;
      if (bVar6) {
        local_22c = (undefined4)CONCAT71(extraout_var,1);
      }
      else if (1 < uVar10) {
        std::__cxx11::string::string
                  ((string *)&listFile,"called with invalid argument: ",(allocator *)&fname_abs);
        std::__cxx11::string::append((string *)&listFile);
        cmCommand::SetError(local_238,&listFile);
        goto LAB_003c1b1f;
      }
    }
LAB_003c1741:
    bVar6 = bVar4;
    uVar11 = (ulong)(uVar10 + 1);
  }
  if (fname._M_string_length == 0) {
    pcVar3 = local_238->Makefile;
    std::__cxx11::string::string
              ((string *)&listFile,"include() given empty file name (ignored).",
               (allocator *)&fname_abs);
    cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&listFile);
    std::__cxx11::string::~string((string *)&listFile);
    bVar4 = true;
    goto LAB_003c1bad;
  }
  bVar4 = cmsys::SystemTools::FileIsFullPath(fname._M_dataplus._M_p);
  this_00 = local_238;
  if (!bVar4) {
    std::__cxx11::string::string((string *)&listFile,(string *)&fname);
    std::__cxx11::string::append((char *)&listFile);
    cmMakefile::GetModulesFile_abi_cxx11_(&fname_abs,this_00->Makefile,listFile._M_dataplus._M_p);
    if (fname_abs._M_string_length != 0) {
      std::__cxx11::string::assign((char *)&fname);
    }
    std::__cxx11::string::~string((string *)&fname_abs);
    std::__cxx11::string::~string((string *)&listFile);
  }
  pcVar8 = cmMakefile::GetCurrentSourceDirectory(this_00->Makefile);
  cmsys::SystemTools::CollapseFullPath(&fname_abs,&fname,pcVar8);
  this_01 = cmMakefile::GetGlobalGenerator(this_00->Makefile);
  bVar4 = cmGlobalGenerator::IsExportedTargetsFile(this_01,&fname_abs);
  if (bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&listFile);
    PVar7 = cmMakefile::GetPolicyStatus(this_00->Makefile,CMP0024);
    if (2 < PVar7 - NEW) {
      if (PVar7 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&m,(cmPolicies *)0x18,id);
        poVar9 = std::operator<<((ostream *)&listFile,(string *)&m);
        std::operator<<(poVar9,"\n");
        std::__cxx11::string::~string((string *)&m);
        bVar4 = false;
        pcVar8 = "should";
        t = AUTHOR_WARNING;
        goto LAB_003c196e;
      }
LAB_003c1a01:
      cmGlobalGenerator::GenerateImportFile(this_01,&fname_abs);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&listFile);
      goto LAB_003c1a1b;
    }
    t = FATAL_ERROR;
    bVar4 = true;
    pcVar8 = "may";
LAB_003c196e:
    poVar9 = std::operator<<((ostream *)&listFile,"The file\n  ");
    poVar9 = std::operator<<(poVar9,(string *)&fname_abs);
    poVar9 = std::operator<<(poVar9,"\nwas generated by the export() command.  It ");
    poVar9 = std::operator<<(poVar9,pcVar8);
    std::operator<<(poVar9,
                    " not be used as the argument to the include() command.  Use ALIAS targets instead to refer to targets by alternative names.\n"
                   );
    pcVar3 = this_00->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar3,t,&m);
    std::__cxx11::string::~string((string *)&m);
    if (!bVar4) goto LAB_003c1a01;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&listFile);
    bVar4 = false;
  }
  else {
LAB_003c1a1b:
    std::__cxx11::string::string((string *)&m,fname._M_dataplus._M_p,&local_239);
    pcVar8 = cmMakefile::GetCurrentSourceDirectory(this_00->Makefile);
    cmsys::SystemTools::CollapseFullPath(&listFile,&m,pcVar8);
    std::__cxx11::string::~string((string *)&m);
    if ((!bVar6) || (bVar4 = cmsys::SystemTools::FileExists(listFile._M_dataplus._M_p), bVar4)) {
      bVar5 = cmMakefile::ReadDependentFile
                        (this_00->Makefile,listFile._M_dataplus._M_p,(bool)((byte)local_22c & 1));
      if (resultVarName._M_string_length != 0) {
        if (!bVar5) {
          fname_abs._M_dataplus._M_p = "NOTFOUND";
        }
        cmMakefile::AddDefinition(this_00->Makefile,&resultVarName,fname_abs._M_dataplus._M_p);
      }
      bVar4 = true;
      if ((!bVar5 && !bVar6) && (bVar6 = cmSystemTools::GetFatalErrorOccured(), !bVar6)) {
        std::__cxx11::string::string((string *)&m,"could not find load file:\n  ",&local_239);
        std::__cxx11::string::append((string *)&m);
        cmCommand::SetError(this_00,&m);
        std::__cxx11::string::~string((string *)&m);
        bVar4 = false;
      }
    }
    else {
      bVar4 = true;
      if (resultVarName._M_string_length != 0) {
        cmMakefile::AddDefinition(this_00->Makefile,&resultVarName,"NOTFOUND");
      }
    }
    std::__cxx11::string::~string((string *)&listFile);
  }
  std::__cxx11::string::~string((string *)&fname_abs);
LAB_003c1bad:
  std::__cxx11::string::~string((string *)&resultVarName);
  std::__cxx11::string::~string((string *)&fname);
  return bVar4;
}

Assistant:

bool cmIncludeCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if (args.size()< 1 || args.size() > 4)
    {
      this->SetError("called with wrong number of arguments.  "
                     "include() only takes one file.");
      return false;
    }
  bool optional = false;
  bool noPolicyScope = false;
  std::string fname = args[0];
  std::string resultVarName;

  for (unsigned int i=1; i<args.size(); i++)
    {
    if (args[i] == "OPTIONAL")
      {
      if (optional)
        {
        this->SetError("called with invalid arguments: OPTIONAL used twice");
        return false;
        }
      optional = true;
      }
    else if(args[i] == "RESULT_VARIABLE")
      {
      if (!resultVarName.empty())
        {
        this->SetError("called with invalid arguments: "
            "only one result variable allowed");
        return false;
        }
      if(++i < args.size())
        {
        resultVarName = args[i];
        }
      else
        {
        this->SetError("called with no value for RESULT_VARIABLE.");
        return false;
        }
      }
    else if(args[i] == "NO_POLICY_SCOPE")
      {
      noPolicyScope = true;
      }
      else if(i > 1)  // compat.: in previous cmake versions the second
                      // parameter was ignored if it wasn't "OPTIONAL"
        {
        std::string errorText = "called with invalid argument: ";
        errorText += args[i];
        this->SetError(errorText);
        return false;
        }
    }

  if(fname.empty())
    {
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
                                 "include() given empty file name (ignored).");
    return true;
    }

  if(!cmSystemTools::FileIsFullPath(fname.c_str()))
    {
    // Not a path. Maybe module.
    std::string module = fname;
    module += ".cmake";
    std::string mfile = this->Makefile->GetModulesFile(module.c_str());
    if (!mfile.empty())
      {
      fname = mfile.c_str();
      }
    }

  std::string fname_abs =
      cmSystemTools::CollapseFullPath(fname,
                                 this->Makefile->GetCurrentSourceDirectory());

  cmGlobalGenerator *gg = this->Makefile->GetGlobalGenerator();
  if (gg->IsExportedTargetsFile(fname_abs))
    {
    const char *modal = 0;
    std::ostringstream e;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;

    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0024))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0024) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        modal = "may";
        messageType = cmake::FATAL_ERROR;
      }
    if (modal)
      {
      e << "The file\n  " << fname_abs << "\nwas generated by the export() "
        "command.  It " << modal << " not be used as the argument to the "
        "include() command.  Use ALIAS targets instead to refer to targets "
        "by alternative names.\n";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    gg->GenerateImportFile(fname_abs);
    }

  std::string listFile =
    cmSystemTools::CollapseFullPath(fname.c_str(),
                                  this->Makefile->GetCurrentSourceDirectory());
  if(optional && !cmSystemTools::FileExists(listFile.c_str()))
    {
    if (!resultVarName.empty())
      {
      this->Makefile->AddDefinition(resultVarName, "NOTFOUND");
      }
    return true;
    }

  bool readit =
    this->Makefile->ReadDependentFile(listFile.c_str(), noPolicyScope);

  // add the location of the included file if a result variable was given
  if (!resultVarName.empty())
    {
      this->Makefile->AddDefinition(resultVarName,
                                    readit?fname_abs.c_str():"NOTFOUND");
    }

  if(!optional && !readit && !cmSystemTools::GetFatalErrorOccured())
    {
    std::string m =
      "could not find load file:\n"
      "  ";
    m += fname;
    this->SetError(m);
    return false;
    }
  return true;
}